

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_blendpd_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t imm)

{
  uint64_t local_38;
  uint64_t local_30;
  uint32_t imm_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  if ((imm & 1) == 0) {
    local_30 = d->_q_ZMMReg[0];
  }
  else {
    local_30 = s->_q_ZMMReg[0];
  }
  d->_q_ZMMReg[0] = local_30;
  if ((imm >> 1 & 1) == 0) {
    local_38 = d->_q_ZMMReg[1];
  }
  else {
    local_38 = s->_q_ZMMReg[1];
  }
  d->_q_ZMMReg[1] = local_38;
  return;
}

Assistant:

void glue(helper_dpps, SUFFIX)(CPUX86State *env, Reg *d, Reg *s, uint32_t mask)
{
    float32 iresult = float32_zero;

    if (mask & (1 << 4)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(0), s->ZMM_S(0),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 5)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(1), s->ZMM_S(1),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 6)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(2), s->ZMM_S(2),
                                          &env->sse_status),
                              &env->sse_status);
    }
    if (mask & (1 << 7)) {
        iresult = float32_add(iresult,
                              float32_mul(d->ZMM_S(3), s->ZMM_S(3),
                                          &env->sse_status),
                              &env->sse_status);
    }
    d->ZMM_S(0) = (mask & (1 << 0)) ? iresult : float32_zero;
    d->ZMM_S(1) = (mask & (1 << 1)) ? iresult : float32_zero;
    d->ZMM_S(2) = (mask & (1 << 2)) ? iresult : float32_zero;
    d->ZMM_S(3) = (mask & (1 << 3)) ? iresult : float32_zero;
}